

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall
kratos::VarDuplicated::add_source(VarDuplicated *this,shared_ptr<kratos::AssignStmt> *stmt)

{
  initializer_list<kratos::IRNode_*> __l;
  StmtException *this_00;
  allocator<kratos::IRNode_*> local_81;
  element_type *local_80;
  element_type **local_78;
  size_type local_70;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_68;
  allocator<char> local_39;
  string local_38;
  __shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *local_18;
  shared_ptr<kratos::AssignStmt> *stmt_local;
  VarDuplicated *this_local;
  
  local_18 = &stmt->super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>;
  stmt_local = (shared_ptr<kratos::AssignStmt> *)this;
  this_00 = (StmtException *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Duplicate variable cannot be on left hand side",&local_39);
  local_80 = std::__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>::get(local_18);
  local_78 = &local_80;
  local_70 = 1;
  std::allocator<kratos::IRNode_*>::allocator(&local_81);
  __l._M_len = local_70;
  __l._M_array = (iterator)local_78;
  std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector(&local_68,__l,&local_81);
  StmtException::StmtException(this_00,&local_38,&local_68);
  __cxa_throw(this_00,&StmtException::typeinfo,StmtException::~StmtException);
}

Assistant:

void VarDuplicated::add_source(const std::shared_ptr<AssignStmt> &stmt) {
    throw StmtException("Duplicate variable cannot be on left hand side", {stmt.get()});
}